

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExporterT.hh
# Opt level: O1

StatusInfo __thiscall
OpenMesh::IO::ExporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_>::status
          (ExporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_> *this,EdgeHandle _eh
          )

{
  long lVar1;
  
  lVar1 = (long)*(int *)&(this->mesh_->super_Mesh).
                         super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                         .super_PolyConnectivity.field_0xb0;
  if (-1 < lVar1) {
    return (StatusInfo)
           *(value_type_conflict2 *)
            (*(long *)(*(long *)(*(long *)&(this->mesh_->super_Mesh).
                                           super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                                           .super_PolyConnectivity.field_0x50 + lVar1 * 8) + 0x30) +
            (long)(int)_eh.super_BaseHandle.idx_ * 4);
  }
  return (StatusInfo)0;
}

Assistant:

OpenMesh::Attributes::StatusInfo  status(EdgeHandle _eh) const override
  {
    if (mesh_.has_edge_status())
      return mesh_.status(_eh);
    return OpenMesh::Attributes::StatusInfo();
  }